

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_stats.cpp
# Opt level: O0

string * duckdb::StructStats::ToString_abi_cxx11_(BaseStatistics *stats)

{
  ulong uVar1;
  LogicalType *__rhs;
  size_type sVar2;
  BaseStatistics *in_RSI;
  string *in_RDI;
  idx_t i;
  child_list_t<LogicalType> *child_types;
  string *result;
  BaseStatistics *in_stack_00000188;
  size_type in_stack_ffffffffffffff28;
  type in_stack_ffffffffffffff30;
  string *__rhs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string local_78 [32];
  string local_58 [32];
  ulong local_38;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *local_30;
  undefined1 local_11;
  BaseStatistics *local_10;
  
  local_11 = 0;
  __rhs_00 = in_RDI;
  local_10 = in_RSI;
  ::std::__cxx11::string::string((string *)in_RDI);
  ::std::__cxx11::string::operator+=((string *)__rhs_00," {");
  __rhs = BaseStatistics::GetType(local_10);
  local_30 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)StructType::GetChildTypes_abi_cxx11_(&in_stack_ffffffffffffff30->type);
  for (local_38 = 0; uVar1 = local_38,
      sVar2 = ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              ::size(local_30), uVar1 < sVar2; local_38 = local_38 + 1) {
    if (local_38 != 0) {
      ::std::__cxx11::string::operator+=((string *)__rhs_00,", ");
    }
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
    ::operator[]((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                  *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (char *)__rhs);
    in_stack_ffffffffffffff30 =
         unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics>,_false>::
         operator[]((unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics>,_false>
                     *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    BaseStatistics::ToString_abi_cxx11_(in_stack_00000188);
    ::std::operator+(in_stack_ffffffffffffff68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
    ::std::__cxx11::string::operator+=((string *)__rhs_00,local_58);
    ::std::__cxx11::string::~string(local_58);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    ::std::__cxx11::string::~string(local_78);
  }
  ::std::__cxx11::string::operator+=((string *)__rhs_00,"}");
  return in_RDI;
}

Assistant:

string StructStats::ToString(const BaseStatistics &stats) {
	string result;
	result += " {";
	auto &child_types = StructType::GetChildTypes(stats.GetType());
	for (idx_t i = 0; i < child_types.size(); i++) {
		if (i > 0) {
			result += ", ";
		}
		result += child_types[i].first + ": " + stats.child_stats[i].ToString();
	}
	result += "}";
	return result;
}